

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O1

void al_draw_filled_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ALLEGRO_VERTEX vertex_cache [256];
  float local_2438;
  float fStack_2434;
  float local_2418 [2306];
  
  fVar11 = get_scale();
  fVar12 = (rx + ry) * 0.5;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  uVar3 = (uint)(fVar11 * 10.0 * fVar12 * 0.25);
  if ((int)uVar3 < 2) {
    al_draw_filled_rectangle(x1,y1,x2,y2,color);
    return;
  }
  uVar7 = 0x3f;
  if ((int)uVar3 < 0x3f) {
    uVar7 = uVar3;
  }
  iVar8 = uVar7 + 1;
  fVar11 = 1.5707964 / ((float)iVar8 + -1.0);
  fVar12 = cosf(fVar11);
  fVar11 = sinf(fVar11);
  fVar13 = 1.0;
  fVar14 = 0.0;
  pfVar4 = local_2418;
  do {
    *(ulong *)pfVar4 = CONCAT44(ry * fVar14 + 0.0,rx * fVar13 + 0.0);
    pfVar4 = pfVar4 + 9;
    fVar15 = fVar13 * fVar11;
    fVar13 = fVar13 * fVar12 + fVar14 * -fVar11;
    fVar14 = fVar15 + fVar14 * fVar12;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  lVar6 = (ulong)(uVar7 * 2) * 0x24;
  lVar2 = (ulong)uVar7 * 0x24;
  lVar9 = -0x24;
  lVar10 = 0;
  do {
    uVar1 = *(undefined8 *)((long)local_2418 + lVar9 + lVar2);
    *(ulong *)((long)local_2418 + lVar10 + lVar2) =
         CONCAT44((y1 + ry) - (float)((ulong)uVar1 >> 0x20),(x1 + rx) - (float)uVar1);
    *(float *)((long)local_2418 + lVar10 + lVar6) =
         (x1 + rx) - *(float *)((long)local_2418 + lVar10);
    *(float *)((long)local_2418 + lVar10 + lVar6 + 4) =
         *(float *)((long)local_2418 + lVar10 + 4) + (y2 - ry);
    uVar1 = *(undefined8 *)((long)local_2418 + lVar9 + lVar2);
    *(ulong *)((long)local_2418 + lVar10 + (ulong)(uVar7 * 3) * 0x24) =
         CONCAT44((float)((ulong)uVar1 >> 0x20) + (y2 - ry),(float)uVar1 + (x2 - rx));
    lVar10 = lVar10 + 0x24;
    lVar9 = lVar9 + -0x24;
  } while (lVar2 != lVar10);
  uVar5 = 1;
  if (1 < (int)uVar7) {
    uVar5 = (ulong)uVar7;
  }
  lVar6 = 0;
  local_2438 = color.r;
  fStack_2434 = color.g;
  do {
    *(float *)((long)local_2418 + lVar6) = *(float *)((long)local_2418 + lVar6) + (x2 - rx);
    *(float *)((long)local_2418 + lVar6 + 4) = (y1 + ry) - *(float *)((long)local_2418 + lVar6 + 4);
    lVar6 = lVar6 + 0x24;
  } while (uVar5 * 0x24 != lVar6);
  iVar8 = uVar7 * 4;
  lVar6 = 0;
  do {
    *(float *)((long)local_2418 + lVar6 + 0x14) = local_2438;
    *(float *)((long)local_2418 + lVar6 + 0x18) = fStack_2434;
    *(float *)((long)local_2418 + lVar6 + 0x1c) = color.b;
    *(float *)((long)local_2418 + lVar6 + 0x20) = color.a;
    *(undefined4 *)((long)local_2418 + lVar6 + 8) = 0;
    lVar6 = lVar6 + 0x24;
  } while ((ulong)(iVar8 + (uint)(iVar8 == 0)) * 0x24 != lVar6);
  al_draw_prim(local_2418,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,iVar8,5);
  return;
}

Assistant:

void al_draw_filled_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color)
{
   LOCAL_VERTEX_CACHE;
   int ii;
   float scale = get_scale();
   int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);
   
   /* In case rx and ry are both 0. */
   if (num_segments < 2) {
      al_draw_filled_rectangle(x1, y1, x2, y2, color);
      return;
   }

   if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
      num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
   }
   
   al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

      vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
      vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

      vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
   }
   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
      vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
   }

   for (ii = 0; ii < 4 * num_segments; ii++) {
      vertex_cache[ii].color = color;
      vertex_cache[ii].z = 0;
   }

   /*
   TODO: Doing this as a triangle fan just doesn't sound all that great, perhaps shuffle the vertices somehow to at least make it a strip
   */
   al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_TRIANGLE_FAN);
}